

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3map_io.c
# Opt level: O0

int s3map_read(char *fn,void **out_map,uint32 *out_n_dom,uint32 *out_n_rng,size_t map_elem_size)

{
  int iVar1;
  int32 iVar2;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  uint32 local_64;
  FILE *pFStack_60;
  uint32 swap;
  FILE *fp;
  char *do_chk;
  char *ver;
  uint32 local_40;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 rd_chksum;
  size_t map_elem_size_local;
  uint32 *out_n_rng_local;
  uint32 *out_n_dom_local;
  void **out_map_local;
  char *fn_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  ignore = 0;
  _sv_chksum = map_elem_size;
  map_elem_size_local = (size_t)out_n_rng;
  out_n_rng_local = out_n_dom;
  out_n_dom_local = (uint32 *)out_map;
  out_map_local = (void **)fn;
  pFStack_60 = s3open(fn,"rb",&local_64);
  if (pFStack_60 == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    do_chk = s3get_gvn_fattr("version");
    if (do_chk == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
              ,0x53,"No version attribute for %s\n",out_map_local);
      exit(1);
    }
    iVar1 = strcmp(do_chk,"1.2");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
              ,0x4f,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_map_local,do_chk
              ,"1.2");
      exit(1);
    }
    fp = (FILE *)s3get_gvn_fattr("chksum0");
    iVar2 = bio_fread((void *)map_elem_size_local,4,1,pFStack_60,local_64,&ignore);
    if (iVar2 == 1) {
      iVar2 = bio_fread_1d((void **)out_n_dom_local,_sv_chksum,out_n_rng_local,pFStack_60,local_64,
                           &ignore);
      if (iVar2 < 0) {
        s3close(pFStack_60);
        fn_local._4_4_ = -1;
      }
      else {
        if (fp != (FILE *)0x0) {
          iVar2 = bio_fread(&local_40,4,1,pFStack_60,local_64,(uint32 *)((long)&ver + 4));
          if (iVar2 != 1) {
            s3close(pFStack_60);
            return -1;
          }
          if (local_40 != ignore) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
                    ,0x76,"Checksum error; read corrupted data.\n");
            exit(1);
          }
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
                ,0x7a,"Read %s [%u mappings to %u]\n",out_map_local,(ulong)*out_n_rng_local,
                CONCAT44(uVar3,*(undefined4 *)map_elem_size_local));
        fn_local._4_4_ = 0;
      }
    }
    else {
      s3close(pFStack_60);
      fn_local._4_4_ = -1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3map_read(const char *fn,
	   void **out_map,
	   uint32 *out_n_dom,
	   uint32 *out_n_rng,
	   size_t map_elem_size)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL) {
	return S3_ERROR;
    }

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, MAP_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, MAP_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }

    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread(out_n_rng,
	       sizeof(uint32),
	       1,
	       fp,
	       swap,
	       &rd_chksum) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    if (bio_fread_1d(out_map,
		  map_elem_size,
		  out_n_dom,
		  fp,
		  swap,
		  &rd_chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }

    if (do_chk) {
	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    
	    return S3_ERROR;
	}
	
	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupted data.\n");
	}
    }

    E_INFO("Read %s [%u mappings to %u]\n", fn, *out_n_dom, *out_n_rng);

    return S3_SUCCESS;
}